

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O0

void __thiscall lumeview::Renderer::Renderer(Renderer *this)

{
  Shader *local_28;
  Renderer *this_local;
  
  std::vector<lumeview::Renderer::Stage,_std::allocator<lumeview::Renderer::Stage>_>::vector
            (&this->m_stages);
  local_28 = this->m_shaders[0];
  do {
    Shader::Shader(local_28);
    local_28 = local_28 + 1;
  } while ((string *)local_28 != &this->m_shaderPath);
  std::__cxx11::string::string((string *)&this->m_shaderPath,(string *)SHADER_PATH_abi_cxx11_);
  return;
}

Assistant:

Renderer::
Renderer() :
	m_shaderPath (SHADER_PATH)
{}